

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_state.hpp
# Opt level: O0

void __thiscall
foxxll::shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
          (shared_state<foxxll::request_queue_impl_worker::thread_state> *this,value_type *new_state
          )

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  value_type *new_state_local;
  shared_state<foxxll::request_queue_impl_worker::thread_state> *this_local;
  
  lock._8_8_ = new_state;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  this->state_ = *(value_type *)lock._8_8_;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void set_to(const value_type& new_state)
    {
        std::unique_lock<std::mutex> lock(mutex_);
        state_ = new_state;
        lock.unlock();
        cv_.notify_all();
    }